

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m4vd_api.c
# Opt level: O3

MPP_RET hal_vpu_mpg4d_init(void *hal,MppHalCfg *cfg)

{
  RK_U32 RVar1;
  MPP_RET MVar2;
  code *pcVar3;
  uint uVar4;
  code *UNRECOVERED_JUMPTABLE;
  code *pcVar5;
  code *pcVar6;
  code *pcVar7;
  
  if (hal == (void *)0x0) {
    return MPP_ERR_VALUE;
  }
  memset(hal,0,0xa8);
  RVar1 = mpp_get_vcodec_type();
  if (((RVar1 & 3) == 0) &&
     (_mpp_log_l(2,"hal_m4vd_api","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "hw_flag & ((1 << VPU_CLIENT_VDPU2) | (1 << VPU_CLIENT_VDPU1))",
                 "hal_vpu_mpg4d_init",0x3c), (mpp_debug._3_1_ & 0x10) != 0)) {
    abort();
  }
  uVar4 = 2;
  if ((RVar1 & 1) == 0) {
    uVar4 = RVar1 * 2 & 4;
  }
  if (uVar4 == 4) {
    pcVar3 = vdpu2_mpg4d_wait;
    pcVar5 = vdpu2_mpg4d_start;
    pcVar6 = vdpu2_mpg4d_gen_regs;
    pcVar7 = vdpu2_mpg4d_deinit;
    UNRECOVERED_JUMPTABLE = vdpu2_mpg4d_init;
  }
  else {
    if (uVar4 != 2) {
      return MPP_ERR_INIT;
    }
    pcVar3 = vdpu1_mpg4d_wait;
    pcVar5 = vdpu1_mpg4d_start;
    pcVar6 = vdpu1_mpg4d_gen_regs;
    pcVar7 = vdpu1_mpg4d_deinit;
    UNRECOVERED_JUMPTABLE = vdpu1_mpg4d_init;
  }
  *(code **)((long)hal + 0x68) = UNRECOVERED_JUMPTABLE;
  *(code **)((long)hal + 0x70) = pcVar7;
  *(code **)((long)hal + 0x78) = pcVar6;
  *(code **)((long)hal + 0x80) = pcVar5;
  *(code **)((long)hal + 0x88) = pcVar3;
  *(undefined8 *)((long)hal + 0x90) = 0;
  *(undefined8 *)((long)hal + 0x98) = 0;
  *(undefined8 *)((long)hal + 0xa0) = 0;
  MVar2 = (*UNRECOVERED_JUMPTABLE)(hal,cfg);
  return MVar2;
}

Assistant:

static MPP_RET hal_vpu_mpg4d_init(void *hal, MppHalCfg *cfg)
{
    hal_mpg4_ctx *p_hal = (hal_mpg4_ctx *)hal;
    MppHalApi *p_api = NULL;
    VpuHwMode hw_mode = MODE_NULL;
    RK_U32 hw_flag = 0;

    if (NULL == p_hal)
        return MPP_ERR_VALUE;

    memset(p_hal, 0, sizeof(hal_mpg4_ctx));
    p_api = &p_hal->hal_api;

    hw_flag = mpp_get_vcodec_type();
    mpp_assert(hw_flag & (HAVE_VDPU2 | HAVE_VDPU1));

    if (hw_flag & HAVE_VDPU2)
        hw_mode = VDPU2_MODE;
    if (hw_flag & HAVE_VDPU1)
        hw_mode = VDPU1_MODE;

    switch (hw_mode) {
    case VDPU2_MODE:
        p_api->init = vdpu2_mpg4d_init;
        p_api->deinit = vdpu2_mpg4d_deinit;
        p_api->reg_gen = vdpu2_mpg4d_gen_regs;
        p_api->start = vdpu2_mpg4d_start;
        p_api->wait = vdpu2_mpg4d_wait;
        p_api->reset = NULL;
        p_api->flush = NULL;
        p_api->control = NULL;
        break;
    case VDPU1_MODE:
        p_api->init = vdpu1_mpg4d_init;
        p_api->deinit = vdpu1_mpg4d_deinit;
        p_api->reg_gen = vdpu1_mpg4d_gen_regs;
        p_api->start = vdpu1_mpg4d_start;
        p_api->wait = vdpu1_mpg4d_wait;
        p_api->reset = NULL;
        p_api->flush = NULL;
        p_api->control = NULL;
        break;
    default:
        return MPP_ERR_INIT;
        break;
    }

    return p_api->init (hal, cfg);
}